

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O3

bool __thiscall
cppcms::sessions::session_file_storage::read_all(session_file_storage *this,int fd,void *vbuf,int n)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  
  if (0 < n) {
    do {
      sVar2 = read(fd,vbuf,(ulong)(uint)n);
      iVar1 = (int)sVar2;
      if (iVar1 < 0) {
        piVar3 = __errno_location();
        if (*piVar3 != 4) {
          return false;
        }
      }
      else {
        if (iVar1 == 0) {
          return false;
        }
        n = n - iVar1;
      }
    } while (0 < n);
  }
  return true;
}

Assistant:

bool session_file_storage::read_all(int fd,void *vbuf,int n)
{
	char *buf=reinterpret_cast<char *>(vbuf);
	while(n > 0) {
		int res = ::read(fd,buf,n);
		if(res < 0 && errno==EINTR)
			continue;
		if(res <= 0)
			return false;
		n-=res;
	}
	return true;
}